

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::initFactorRings(CLUFactor<double> *this)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  reference pvVar4;
  long lVar5;
  undefined4 *in_RDI;
  int in_stack_0000000c;
  Pring *ring;
  int *cperm;
  int *rperm;
  int i;
  int local_c;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  lVar2 = *(long *)(in_RDI + 0x14);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&ring->next,in_stack_0000000c);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&ring->next,in_stack_0000000c);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&ring->next,in_stack_0000000c);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&ring->next,in_stack_0000000c);
  for (local_c = in_RDI[1] - in_RDI[0x82]; -1 < local_c; local_c = local_c + -1) {
    lVar5 = *(long *)(in_RDI + 0x8e) + (long)local_c * 0x20;
    *(long *)(*(long *)(in_RDI + 0x8e) + (long)local_c * 0x20) = lVar5;
    *(long *)(*(long *)(in_RDI + 0x8e) + (long)local_c * 0x20 + 8) = lVar5;
    lVar5 = *(long *)(in_RDI + 0x92) + (long)local_c * 0x20;
    *(long *)(*(long *)(in_RDI + 0x92) + (long)local_c * 0x20) = lVar5;
    *(long *)(*(long *)(in_RDI + 0x92) + (long)local_c * 0x20 + 8) = lVar5;
  }
  local_c = 0;
  do {
    if ((int)in_RDI[1] <= local_c) {
      return;
    }
    if (*(int *)(lVar1 + (long)local_c * 4) < 0) {
      if (*(int *)(*(long *)(in_RDI + 0x52) + (long)local_c * 4) < 1) {
        *in_RDI = 2;
        return;
      }
      plVar3 = (long *)(*(long *)(in_RDI + 0x92) +
                       (long)*(int *)(*(long *)(in_RDI + 0x52) + (long)local_c * 4) * 0x20);
      *(long *)(*(long *)(in_RDI + 0x90) + (long)local_c * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)(in_RDI + 0x90) + (long)local_c * 0x20) + 8) =
           *(long *)(in_RDI + 0x90) + (long)local_c * 0x20;
      *(long **)(*(long *)(in_RDI + 0x90) + (long)local_c * 0x20 + 8) = plVar3;
      *plVar3 = *(long *)(in_RDI + 0x90) + (long)local_c * 0x20;
      *(int *)(*(long *)(in_RDI + 0x90) + (long)local_c * 0x20 + 0x10) = local_c;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7a),(long)local_c);
      *pvVar4 = -1.0;
    }
    if (*(int *)(lVar2 + (long)local_c * 4) < 0) {
      if (*(int *)(*(long *)(in_RDI + 0x80) + (long)local_c * 4) < 1) {
        *in_RDI = 2;
        return;
      }
      plVar3 = (long *)(*(long *)(in_RDI + 0x8e) +
                       (long)*(int *)(*(long *)(in_RDI + 0x80) + (long)local_c * 4) * 0x20);
      *(long *)(*(long *)(in_RDI + 0x8c) + (long)local_c * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)(in_RDI + 0x8c) + (long)local_c * 0x20) + 8) =
           *(long *)(in_RDI + 0x8c) + (long)local_c * 0x20;
      *(long **)(*(long *)(in_RDI + 0x8c) + (long)local_c * 0x20 + 8) = plVar3;
      *plVar3 = *(long *)(in_RDI + 0x8c) + (long)local_c * 0x20;
      *(int *)(*(long *)(in_RDI + 0x8c) + (long)local_c * 0x20 + 0x10) = local_c;
      *(undefined4 *)(*(long *)(in_RDI + 0x78) + (long)local_c * 4) = 0;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}